

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ptrmapPut(BtShared *pBt,Pgno key,u8 eType,Pgno parent,int *pRC)

{
  int iVar1;
  Pgno PVar2;
  u32 uVar3;
  int iVar4;
  void *pvVar5;
  u32 in_ECX;
  char in_DL;
  Pgno in_ESI;
  Pager *in_RDI;
  int *in_R8;
  int rc;
  int offset;
  Pgno iPtrmap;
  u8 *pPtrmap;
  DbPage *pDbPage;
  PgHdr *in_stack_ffffffffffffffb8;
  DbPage *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*in_R8 == 0) {
    if (in_ESI == 0) {
      iVar1 = sqlite3CorruptError(0);
      *in_R8 = iVar1;
    }
    else {
      PVar2 = ptrmapPageno((BtShared *)in_RDI,in_ESI);
      iVar1 = sqlite3PagerAcquire(in_RDI,in_ESI,
                                  (DbPage **)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
                                  (int)((ulong)in_R8 >> 0x20));
      if (iVar1 == 0) {
        iVar1 = ((in_ESI - PVar2) + -1) * 5;
        if (iVar1 < 0) {
          iVar1 = sqlite3CorruptError(0);
          *in_R8 = iVar1;
        }
        else {
          pvVar5 = sqlite3PagerGetData(local_28);
          if ((in_DL != *(char *)((long)pvVar5 + (long)iVar1)) ||
             (uVar3 = sqlite3Get4byte((u8 *)((long)pvVar5 + (long)(iVar1 + 1))), uVar3 != in_ECX)) {
            iVar4 = sqlite3PagerWrite(in_stack_ffffffffffffffb8);
            *in_R8 = iVar4;
            if (iVar4 == 0) {
              *(char *)((long)pvVar5 + (long)iVar1) = in_DL;
              sqlite3Put4byte((uchar *)((long)pvVar5 + (long)(iVar1 + 1)),in_ECX);
            }
          }
        }
        sqlite3PagerUnref((DbPage *)0x1383a9);
      }
      else {
        *in_R8 = iVar1;
      }
    }
  }
  return;
}

Assistant:

static void ptrmapPut(BtShared *pBt, Pgno key, u8 eType, Pgno parent, int *pRC){
  DbPage *pDbPage;  /* The pointer map page */
  u8 *pPtrmap;      /* The pointer map data */
  Pgno iPtrmap;     /* The pointer map page number */
  int offset;       /* Offset in pointer map page */
  int rc;           /* Return code from subfunctions */

  if( *pRC ) return;

  assert( sqlite3_mutex_held(pBt->mutex) );
  /* The master-journal page number must never be used as a pointer map page */
  assert( 0==PTRMAP_ISPAGE(pBt, PENDING_BYTE_PAGE(pBt)) );

  assert( pBt->autoVacuum );
  if( key==0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage);
  if( rc!=SQLITE_OK ){
    *pRC = rc;
    return;
  }
  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  if( eType!=pPtrmap[offset] || get4byte(&pPtrmap[offset+1])!=parent ){
    TRACE(("PTRMAP_UPDATE: %d->(%d,%d)\n", key, eType, parent));
    *pRC= rc = sqlite3PagerWrite(pDbPage);
    if( rc==SQLITE_OK ){
      pPtrmap[offset] = eType;
      put4byte(&pPtrmap[offset+1], parent);
    }
  }

ptrmap_exit:
  sqlite3PagerUnref(pDbPage);
}